

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O2

SizedPtr google::protobuf::internal::AllocateAtLeast(size_t size)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  SizedPtr SVar4;
  
  puVar1 = (undefined8 *)__tls_get_addr(&PTR_004add90);
  if ((code *)*puVar1 == (code *)0x0) {
    pvVar2 = operator_new(size);
  }
  else {
    auVar3 = (*(code *)*puVar1)(size,puVar1[1]);
    size = auVar3._8_8_;
    pvVar2 = auVar3._0_8_;
  }
  SVar4.n = size;
  SVar4.p = pvVar2;
  return SVar4;
}

Assistant:

inline SizedPtr AllocateAtLeast(size_t size) {
#if !defined(NDEBUG) && defined(ABSL_HAVE_THREAD_LOCAL) && \
    defined(__cpp_inline_variables)
  if (allocate_at_least_hook != nullptr) {
    return allocate_at_least_hook(size, allocate_at_least_hook_context);
  }
#endif  // !NDEBUG && ABSL_HAVE_THREAD_LOCAL && __cpp_inline_variables
  return {::operator new(size), size};
}